

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playGround.cpp
# Opt level: O3

void __thiscall PlayGround::kill_agent(PlayGround *this)

{
  bool *pbVar1;
  pair<int,_int> *ppVar2;
  int iVar3;
  int iVar4;
  pointer pvVar5;
  long lVar6;
  long lVar7;
  iterator iVar8;
  bool bVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  PlayGround *unaff_RBX;
  ulong uVar13;
  pair<int,_int> pVar14;
  pair<int,_int> locationn;
  pair<int,_int> locationn_00;
  pair<int,_int> locationn_01;
  pair<int,_int> locationn_02;
  char *this_00;
  Room room;
  sensor sStack_5c;
  undefined1 auStack_50 [16];
  PlayGround *pPStack_40;
  undefined1 local_18 [16];
  
  uVar13 = (long)(this->playableworld).agent_location.second - 1;
  pvVar5 = (this->playableworld).world.boxes.
           super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->playableworld).world.boxes.
                  super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5 >> 3) *
           -0x5555555555555555;
  uVar10 = uVar13;
  if (uVar13 <= uVar12 && uVar12 - uVar13 != 0) {
    uVar10 = (long)(this->playableworld).agent_location.first - 1;
    lVar6 = *(long *)&pvVar5[uVar13].super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                      super__Vector_impl_data;
    unaff_RBX = this;
    if (uVar10 < (ulong)((long)*(pointer *)
                                ((long)&pvVar5[uVar13].
                                        super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                                        super__Vector_impl_data + 8) - lVar6 >> 4)) {
      ppVar2 = (pair<int,_int> *)(lVar6 + uVar10 * 0x10);
      local_18._0_8_ = *ppVar2;
      local_18._8_8_ = ppVar2[1];
      bVar9 = Room::has_wumpus((Room *)local_18);
      if ((bVar9) || (bVar9 = Room::has_pit((Room *)local_18), bVar9)) {
        this->is_agent_dead = true;
      }
      return;
    }
  }
  this_00 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  iVar3 = *(int *)(uVar10 + 0xf4);
  uVar12 = (long)iVar3 - 1;
  lVar6 = *(long *)(uVar10 + 0xb8);
  uVar13 = (*(long *)(uVar10 + 0xc0) - lVar6 >> 3) * -0x5555555555555555;
  pPStack_40 = unaff_RBX;
  if (uVar12 <= uVar13 && uVar13 - uVar12 != 0) {
    iVar4 = *(int *)(uVar10 + 0xf0);
    lVar7 = *(long *)(lVar6 + uVar12 * 0x18);
    if ((long)iVar4 - 1U < (ulong)(*(long *)(lVar6 + 8 + uVar12 * 0x18) - lVar7 >> 4)) {
      ppVar2 = (pair<int,_int> *)(lVar7 + ((long)iVar4 - 1U) * 0x10);
      auStack_50._0_8_ = *ppVar2;
      auStack_50._8_8_ = ppVar2[1];
      ((PlayGround *)this_00)->point = 0;
      ((PlayGround *)this_00)->move = false;
      ((PlayGround *)this_00)->shoot = false;
      (((PlayGround *)this_00)->p).stench = false;
      (((PlayGround *)this_00)->p).breeze = false;
      *(undefined8 *)&(((PlayGround *)this_00)->p).glitter = 0;
      *(undefined8 *)&(((PlayGround *)this_00)->action).turnright = 0;
      bVar9 = Room::get_breeze((Room *)auStack_50);
      if (bVar9) {
        pVar14.second = iVar3;
        pVar14.first = iVar4;
        sensor::sensor(&sStack_5c,pVar14,B);
        iVar8._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar8._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar8,&sStack_5c);
        }
        else {
          (iVar8._M_current)->sense = sStack_5c.sense;
          (iVar8._M_current)->location = sStack_5c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
        *(undefined1 *)(uVar10 + 7) = 1;
      }
      bVar9 = Room::get_stench((Room *)auStack_50);
      if (bVar9) {
        locationn.second = iVar3;
        locationn.first = iVar4;
        sensor::sensor(&sStack_5c,locationn,S);
        iVar8._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar8._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar8,&sStack_5c);
        }
        else {
          (iVar8._M_current)->sense = sStack_5c.sense;
          (iVar8._M_current)->location = sStack_5c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
        *(undefined1 *)(uVar10 + 6) = 1;
      }
      bVar9 = Room::get_glitter((Room *)auStack_50);
      if (bVar9) {
        locationn_00.second = iVar3;
        locationn_00.first = iVar4;
        sensor::sensor(&sStack_5c,locationn_00,G);
        iVar8._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar8._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar8,&sStack_5c);
        }
        else {
          (iVar8._M_current)->sense = sStack_5c.sense;
          (iVar8._M_current)->location = sStack_5c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
        *(undefined1 *)(uVar10 + 0xe) = 1;
        *(undefined1 *)(uVar10 + 8) = 1;
      }
      bVar9 = Room::has_pit((Room *)auStack_50);
      if (bVar9) {
        locationn_01.second = iVar3;
        locationn_01.first = iVar4;
        sensor::sensor(&sStack_5c,locationn_01,P);
        iVar8._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar8._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar8,&sStack_5c);
        }
        else {
          (iVar8._M_current)->sense = sStack_5c.sense;
          (iVar8._M_current)->location = sStack_5c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
      }
      bVar9 = Room::has_wumpus((Room *)auStack_50);
      if (bVar9) {
        locationn_02.second = iVar3;
        locationn_02.first = iVar4;
        sensor::sensor(&sStack_5c,locationn_02,W);
        iVar8._M_current = *(sensor **)&(((PlayGround *)this_00)->p).glitter;
        if (iVar8._M_current == *(sensor **)&(((PlayGround *)this_00)->action).turnright) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)this_00,iVar8,&sStack_5c);
        }
        else {
          (iVar8._M_current)->sense = sStack_5c.sense;
          (iVar8._M_current)->location = sStack_5c.location;
          pbVar1 = &(((PlayGround *)this_00)->p).glitter;
          *(long *)pbVar1 = *(long *)pbVar1 + 0xc;
        }
        *(undefined1 *)(uVar10 + 0xb) = 1;
      }
      if (*(char *)(uVar10 + 0xc) != '\x01') {
        return;
      }
      unaff_RBX = (PlayGround *)this_00;
      if (*(sensor **)&(((PlayGround *)this_00)->p).glitter != *(sensor **)this_00) {
        pVar14 = sensor::get_Location(*(sensor **)this_00);
        sensor::sensor(&sStack_5c,pVar14,scream);
        *(undefined1 *)(uVar10 + 10) = 1;
        return;
      }
      goto LAB_00106fed;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00106fed:
  uVar11 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                      0);
  if (*(void **)unaff_RBX != (void *)0x0) {
    operator_delete(*(void **)unaff_RBX);
  }
  _Unwind_Resume(uVar11);
}

Assistant:

void PlayGround::kill_agent()
{
    pair<int, int> agent_location = make_pair(playableworld.agent_location.first - 1, playableworld.agent_location.second - 1);
    Room room = playableworld.world.boxes.at(agent_location.second).at(agent_location.first);
    if (room.has_wumpus() || room.has_pit())
    {
        is_agent_dead = true;
    }
}